

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_gles2.c
# Opt level: O1

int main(void)

{
  char *__s;
  char cVar1;
  int iVar2;
  XVisualInfo *visinfo;
  GLXFBConfig p_Var3;
  Window WVar4;
  undefined8 uVar5;
  void *pvVar6;
  size_t __n;
  long lVar7;
  char *filename;
  void *pvVar8;
  GLuint q;
  int context_attribs [7];
  int local_3c;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  uStack_28 = 0x2092;
  uStack_24 = 0;
  local_38 = 0x400009126;
  uStack_30 = 0x2091;
  local_2c = 2;
  dpy = get_display_or_skip();
  cVar1 = epoxy_has_glx_extension(dpy,0,"GLX_EXT_create_context_es2_profile");
  if (cVar1 == '\0') {
    iVar2 = 0x1030bc;
    filename = (char *)0x4d;
    goto LAB_001026f1;
  }
  visinfo = get_glx_visual(dpy);
  p_Var3 = get_fbconfig_for_visinfo(dpy,visinfo);
  WVar4 = get_glx_window(dpy,visinfo,false);
  uVar5 = (*_epoxy_glXCreateContextAttribsARB)(dpy,p_Var3,0,1,&local_38);
  (*_epoxy_glXMakeCurrent)(dpy,WVar4,uVar5);
  cVar1 = epoxy_is_desktop_gl();
  if (cVar1 == '\0') {
    iVar2 = epoxy_gl_version();
    if (iVar2 < 0x14) {
      iVar2 = epoxy_gl_version();
      errx(SUB84((double)((float)iVar2 / 10.0),0),1,
           "GLES2 context creation made a version %f context\n");
    }
    else {
      iVar2 = (*_epoxy_glCreateShader)(0x8b30);
      if (iVar2 != 0) {
        (*_epoxy_glDeleteShader)(iVar2);
        iVar2 = epoxy_gl_version();
        if (iVar2 < 0x1e) {
          return 0;
        }
        local_3c = 0;
        (*_epoxy_glGenQueries)(1,&local_3c);
        if (local_3c != 0) {
          (*_epoxy_glDeleteQueries)(1,&local_3c);
          return 0;
        }
        iVar2 = 0x103167;
        goto LAB_001026ec;
      }
    }
    iVar2 = 0x10314e;
  }
  else {
    iVar2 = 0x1030ed;
  }
LAB_001026ec:
  filename = (char *)0x1;
LAB_001026f1:
  errx();
  pvVar6 = dlwrap_real_dlopen(filename,iVar2);
  pvVar8 = (void *)0x0;
  if (filename != (char *)0x0) {
    lVar7 = 0;
    do {
      __s = *(char **)((long)&wrapped_libs[0].filename + lVar7);
      __n = strlen(__s);
      iVar2 = strncmp(__s,filename,__n);
      if (iVar2 == 0) {
        pvVar8 = (void *)((long)&wrapped_libs[0].filename + lVar7);
        break;
      }
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
  }
  if (pvVar8 != (void *)0x0) {
    *(void **)((long)pvVar8 + 0x10) = pvVar6;
    pvVar6 = pvVar8;
  }
  return (int)pvVar6;
}

Assistant:

int main(void)
{
    bool pass = true;
    XVisualInfo *vis;
    Window win;
    GLXContext ctx;
    GLXFBConfig config;
    int context_attribs[] = {
        GLX_CONTEXT_PROFILE_MASK_ARB, GLX_CONTEXT_ES2_PROFILE_BIT_EXT,
        GLX_CONTEXT_MAJOR_VERSION_ARB, 2,
        GLX_CONTEXT_MINOR_VERSION_ARB, 0,
        0
    };
    GLuint shader;

    dpy = get_display_or_skip();

    if (!epoxy_has_glx_extension(dpy, 0, "GLX_EXT_create_context_es2_profile"))
        errx(77, "Test requires GLX_EXT_create_context_es2_profile");

    vis = get_glx_visual(dpy);
    config = get_fbconfig_for_visinfo(dpy, vis);
    win = get_glx_window(dpy, vis, false);

    ctx = glXCreateContextAttribsARB(dpy, config, NULL, true,
                                     context_attribs);

    glXMakeCurrent(dpy, win, ctx);

    if (epoxy_is_desktop_gl()) {
        errx(1, "GLES2 context creation made a desktop context\n");
    }

    if (epoxy_gl_version() < 20) {
        errx(1, "GLES2 context creation made a version %f context\n",
             epoxy_gl_version() / 10.0f);
    }

    /* Test using an entrypoint that's in GLES2, but not the desktop GL ABI. */
    shader = glCreateShader(GL_FRAGMENT_SHADER);
    if (shader == 0)
        errx(1, "glCreateShader() failed\n");
    glDeleteShader(shader);

    if (epoxy_gl_version() >= 30) {
        GLuint q = 0;

        glGenQueries(1, &q);
        if (!q)
            errx(1, "glGenQueries() failed\n");
        glDeleteQueries(1, &q);
    }

    return pass != true;
}